

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaTabBar::contextMenuEvent(QMdiAreaTabBar *this,QContextMenuEvent *event)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  QObject *pQVar4;
  int *piVar5;
  QWidget *this_01;
  
  iVar3 = QTabBar::tabAt(&this->super_QTabBar,(QPoint *)(event + 0x28));
  pQVar4 = (QObject *)subWindowFromIndex(this,iVar3);
  if ((pQVar4 == (QObject *)0x0) ||
     (piVar5 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4), piVar5 == (int *)0x0
     )) {
    event[0xc] = (QContextMenuEvent)0x0;
    return;
  }
  if ((piVar5[1] != 0) && ((*(byte *)(*(long *)(pQVar4 + 0x20) + 10) & 1) == 0)) {
    this_00 = *(QMdiSubWindowPrivate **)(pQVar4 + 8);
    pDVar1 = (this_00->systemMenu).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       ((this_00->systemMenu).wp.value != (QObject *)0x0)) {
      iVar3 = QTabBar::currentIndex(&this->super_QTabBar);
      this_01 = &subWindowFromIndex(this,iVar3)->super_QWidget;
      bVar2 = QWidget::isMaximized(this_01);
      if (bVar2) {
        QMdiSubWindowPrivate::setVisible(this_00,MoveAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,ResizeAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,MinimizeAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,MaximizeAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,RestoreAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,StayOnTopAction,false);
      }
      QMenu::exec((QMenu *)(this_00->systemMenu).wp.value,(QPoint *)(event + 0x30),(QAction *)0x0);
      if (piVar5[1] != 0) {
        QMdiSubWindowPrivate::updateActions(this_00);
      }
      goto LAB_0043edb7;
    }
  }
  event[0xc] = (QContextMenuEvent)0x0;
LAB_0043edb7:
  LOCK();
  *piVar5 = *piVar5 + -1;
  UNLOCK();
  if (*piVar5 != 0) {
    return;
  }
  operator_delete(piVar5);
  return;
}

Assistant:

void QMdiAreaTabBar::contextMenuEvent(QContextMenuEvent *event)
{
    QPointer<QMdiSubWindow> subWindow = subWindowFromIndex(tabAt(event->pos()));
    if (!subWindow || subWindow->isHidden()) {
        event->ignore();
        return;
    }

#if QT_CONFIG(menu)
    QMdiSubWindowPrivate *subWindowPrivate = subWindow->d_func();
    if (!subWindowPrivate->systemMenu) {
        event->ignore();
        return;
    }

    QMdiSubWindow *currentSubWindow = subWindowFromIndex(currentIndex());
    Q_ASSERT(currentSubWindow);

    // We don't want these actions to show up in the system menu when the
    // current sub-window is maximized, i.e. covers the entire viewport.
    if (currentSubWindow->isMaximized()) {
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MoveAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::ResizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MinimizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MaximizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::RestoreAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::StayOnTopAction, false);
    }

    // Show system menu.
    subWindowPrivate->systemMenu->exec(event->globalPos());
    if (!subWindow)
        return;

    // Restore action visibility.
    subWindowPrivate->updateActions();
#endif // QT_CONFIG(menu)
}